

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::initialiseLpColCost(HEkk *this)

{
  int iVar1;
  ObjSense OVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  double dVar7;
  
  dVar7 = ldexp(1.0,(this->options_->super_HighsOptionsStruct).cost_scale_factor);
  iVar1 = (this->lp_).num_col_;
  OVar2 = (this->lp_).sense_;
  pdVar3 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    pdVar4[lVar6] = pdVar3[lVar6] * (double)OVar2 * dVar7;
    pdVar5[lVar6] = 0.0;
  }
  return;
}

Assistant:

void HEkk::initialiseLpColCost() {
  double cost_scale_factor = pow(2.0, options_->cost_scale_factor);
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    info_.workCost_[iCol] =
        (HighsInt)lp_.sense_ * cost_scale_factor * lp_.col_cost_[iCol];
    info_.workShift_[iCol] = 0;
  }
}